

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::DynamicMapField::DynamicMapField
          (DynamicMapField *this,Message *default_entry,Message *mapped_default_entry_if_message,
          Arena *arena)

{
  TypeInfo type_info;
  Arena *arena_local;
  Message *mapped_default_entry_if_message_local;
  Message *default_entry_local;
  DynamicMapField *this_local;
  
  MapFieldBase::MapFieldBase(&this->super_MapFieldBase,default_entry,arena);
  type_info = DefaultEntryToTypeInfo(default_entry,mapped_default_entry_if_message);
  UntypedMapBase::UntypedMapBase(&this->map_,arena,type_info);
  return;
}

Assistant:

DynamicMapField::DynamicMapField(const Message* default_entry,
                                 const Message* mapped_default_entry_if_message,
                                 Arena* arena)
    : MapFieldBase(default_entry, arena),
      map_(arena, DefaultEntryToTypeInfo(default_entry,
                                         mapped_default_entry_if_message)) {
  // This invariant is required by `GetMapRaw` to easily access the map
  // member without paying for dynamic dispatch.
  static_assert(MapFieldBaseForParse::MapOffset() ==
                PROTOBUF_FIELD_OFFSET(DynamicMapField, map_));
}